

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv__queue **ppuVar1;
  byte *pbVar2;
  uint uVar3;
  uv__queue *puVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  cmsghdr *__cmsg;
  uint uVar10;
  int iVar11;
  uv__io_t *puVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 uVar15;
  uv_stream_t *stream;
  ulong uVar16;
  msghdr msg;
  int error;
  uv_buf_t local_1b8;
  int local_1a4;
  uv_stream_t *local_1a0;
  cmsghdr *local_198;
  size_t local_190;
  ulong local_188;
  ulong local_180;
  uint *local_178;
  msghdr local_170;
  cmsghdr local_138 [16];
  
  uVar14 = *(uint *)&w[-2].watcher_queue.next;
  if ((0xe < uVar14) || ((0x5080U >> (uVar14 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a7,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uVar3 = *(uint *)&w[-1].pending_queue.next;
  if ((uVar3 & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a8,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)&w[-2].pending_queue;
  lVar7 = *(long *)&w[-1].pevents;
  if (lVar7 != 0) {
    local_170.msg_name = (void *)CONCAT44(local_170.msg_name._4_4_,4);
    if ((uVar14 != 7) && (uVar14 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4de,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar14 = w[1].pevents;
    if (uVar14 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x4ea,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_138,(socklen_t *)&local_170);
      uVar14 = -(uint)local_138[0].cmsg_len;
      local_138[0].cmsg_len = CONCAT44(local_138[0].cmsg_len._4_4_,uVar14);
    }
    else {
      local_138[0].cmsg_len = CONCAT44(local_138[0].cmsg_len._4_4_,uVar14);
      w[1].pevents = 0;
    }
    if (uVar14 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    puVar4 = w[-2].pending_queue.prev;
    iVar11 = *(int *)&puVar4[2].next;
    if (iVar11 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4f7,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)&puVar4[2].next = iVar11 + -1;
    if (((int)uVar14 < 0) || ((uv__io_t *)w[1].cb == w + 1)) {
      uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,4);
      uVar14 = (uint)local_138[0].cmsg_len;
    }
    if (*(code **)(lVar7 + 0x48) != (code *)0x0) {
      (**(code **)(lVar7 + 0x48))(lVar7);
      uVar14 = (uint)local_138[0].cmsg_len;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar14) {
      return;
    }
    puVar12 = (uv__io_t *)w[1].cb;
    if (puVar12 != w + 1) {
      do {
        puVar4 = (uv__queue *)puVar12->cb;
        ((puVar12->pending_queue).next)->next = puVar4;
        puVar4->prev = (puVar12->pending_queue).next;
        *(undefined4 *)((long)&(puVar12->watcher_queue).prev + 4) = 0xffffff83;
        puVar12->cb = (uv__io_cb)&w[1].pending_queue.prev;
        puVar4 = w[1].watcher_queue.next;
        (puVar12->pending_queue).next = puVar4;
        puVar4->next = (uv__queue *)puVar12;
        w[1].watcher_queue.next = (uv__queue *)puVar12;
        puVar12 = (uv__io_t *)w[1].cb;
      } while (puVar12 != w + 1);
    }
    uv__write_callbacks(stream);
    return;
  }
  iVar11 = w->fd;
  if (iVar11 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4af,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)&w[-1].pending_queue.next = uVar3 & 0xfffffbfe;
    local_180 = 0;
    if (uVar14 == 7) {
      local_180 = (ulong)(*(int *)&w[2].cb != 0);
    }
    local_178 = &w[1].events;
    cVar6 = (char)local_180;
    iVar11 = 0x20;
    local_1a0 = stream;
    do {
      uVar13 = local_180;
      if (((w[-1].watcher_queue.prev == (uv__queue *)0x0) ||
          (((ulong)w[-1].pending_queue.next & 0x1000) == 0)) || (iVar11 == 0)) goto LAB_0012006a;
      if (w[-1].watcher_queue.next == (uv__queue *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x414,"void uv__read(uv_stream_t *)");
      }
      local_1b8 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue.next)(stream,0x10000,&local_1b8);
      if ((local_1b8.base == (char *)0x0) || (local_1b8.len == 0)) {
        uVar15 = 0xffffffffffffff97;
        goto LAB_0011ffd8;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x41f,"void uv__read(uv_stream_t *)");
      }
      local_1a4 = iVar11 + -1;
      if ((char)uVar13 == '\0') {
        while( true ) {
          lVar7 = read(w->fd,local_1b8.base,local_1b8.len);
          if (-1 < lVar7) break;
          piVar8 = __errno_location();
          iVar11 = *piVar8;
          if (iVar11 != 4) goto LAB_0011ffab;
        }
      }
      else {
        local_170.msg_flags = 0;
        local_170.msg_iov = (iovec *)&local_1b8;
        local_170.msg_iovlen = 1;
        local_170.msg_name = (void *)0x0;
        local_170.msg_namelen = 0;
        local_170.msg_controllen = 0x100;
        local_170.msg_control = local_138;
        while (lVar7 = uv__recvmsg(w->fd,&local_170,0), lVar7 < 0) {
          piVar8 = __errno_location();
          iVar11 = *piVar8;
          if (iVar11 != 4) goto LAB_0011ffab;
        }
      }
      if (lVar7 == 0) {
        uv__stream_eof(stream,&local_1b8);
        goto LAB_0012006a;
      }
      local_190 = local_1b8.len;
      __cmsg = (cmsghdr *)local_170.msg_control;
      if ((cmsghdr *)local_170.msg_control != (cmsghdr *)0x0 &&
          (0xf < local_170.msg_controllen && cVar6 == '\x01')) {
        do {
          local_198 = __cmsg;
          if (__cmsg->cmsg_type == 1) {
            uVar13 = __cmsg->cmsg_len;
            if (uVar13 < 0x10) {
              __assert_fail("cmsg->cmsg_len >= CMSG_LEN(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                            ,0x3e2,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            if ((uVar13 & 3) != 0) {
              __assert_fail("count % sizeof(fd) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                            ,0x3e4,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            if (uVar13 - 0x10 != 0) {
              local_188 = uVar13 - 0x10 >> 2;
              uVar13 = local_188 + (local_188 == 0);
              uVar16 = 0;
              do {
                uVar14 = *(uint *)((long)&__cmsg[1].cmsg_len + uVar16 * 4);
                puVar9 = local_178;
                if (*local_178 != 0xffffffff) {
                  puVar9 = *(uint **)&w[1].fd;
                  if (puVar9 == (uint *)0x0) {
                    puVar9 = (uint *)uv__malloc(0x28);
                    uVar5 = local_188;
                    if (puVar9 == (uint *)0x0) goto LAB_0012003d;
                    puVar9[0] = 8;
                    puVar9[1] = 0;
LAB_0011fe4b:
                    *(uint **)&w[1].fd = puVar9;
                    uVar10 = puVar9[1];
                    __cmsg = local_198;
                  }
                  else {
                    uVar3 = *puVar9;
                    uVar10 = puVar9[1];
                    if (uVar3 == uVar10) {
                      puVar9 = (uint *)uv__realloc(puVar9,(ulong)(uVar3 + 7) * 4 + 0xc);
                      uVar5 = local_188;
                      if (puVar9 != (uint *)0x0) {
                        *puVar9 = uVar3 + 8;
                        goto LAB_0011fe4b;
                      }
                      goto LAB_0012003d;
                    }
                  }
                  puVar9[1] = uVar10 + 1;
                  puVar9 = puVar9 + (ulong)uVar10 + 2;
                }
                *puVar9 = uVar14;
                uVar16 = uVar16 + 1;
              } while (uVar13 != uVar16);
            }
          }
          else {
            fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
            __cmsg = local_198;
          }
          __cmsg = __cmsg_nxthdr((msghdr *)&local_170,__cmsg);
          stream = local_1a0;
        } while (__cmsg != (cmsghdr *)0x0);
      }
      (*(code *)w[-1].watcher_queue.prev)(stream,lVar7,&local_1b8);
      iVar11 = local_1a4;
    } while ((long)local_190 <= lVar7);
    pbVar2 = (byte *)((long)&w[-1].pending_queue.next + 1);
    *pbVar2 = *pbVar2 | 4;
    goto LAB_0012006a;
  }
  goto LAB_00120072;
LAB_0012003d:
  for (; stream = local_1a0, uVar16 < uVar5; uVar16 = uVar16 + 1) {
    uv__close(uVar14);
  }
  (*(code *)w[-1].watcher_queue.prev)(local_1a0,0xfffffffffffffff4,&local_1b8);
  goto LAB_0012006a;
LAB_0011ffab:
  uVar14 = *(uint *)&w[-1].pending_queue.next;
  if (iVar11 == 0xb) {
    if ((uVar14 >> 0xc & 1) != 0) {
      uv__io_start((uv_loop_t *)w[-2].pending_queue.prev,w,1);
    }
    uVar15 = 0;
LAB_0011ffd8:
    (*(code *)w[-1].watcher_queue.prev)(stream,uVar15,&local_1b8);
  }
  else {
    *(uint *)&w[-1].pending_queue.next = uVar14 & 0xffff3fff;
    (*(code *)w[-1].watcher_queue.prev)(stream,-(long)*piVar8,&local_1b8);
    uVar14 = *(uint *)&w[-1].pending_queue.next;
    if ((uVar14 >> 0xc & 1) != 0) {
      *(uint *)&w[-1].pending_queue.next = uVar14 & 0xffffefff;
      uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,1);
      uVar14 = *(uint *)&w[-1].pending_queue.next;
      if (((uVar14 & 4) != 0) &&
         (*(uint *)&w[-1].pending_queue.next = uVar14 & 0xfffffffb, (uVar14 & 8) != 0)) {
        ppuVar1 = &(w[-2].pending_queue.prev)->prev;
        *(int *)ppuVar1 = *(int *)ppuVar1 + -1;
      }
    }
  }
LAB_0012006a:
  iVar11 = w->fd;
  if (iVar11 != -1) {
LAB_00120072:
    if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue.next & 0x1c00) == 0x1400)) {
      local_138[0].cmsg_len = 0;
      local_138[0].cmsg_level = 0;
      local_138[0].cmsg_type = 0;
      uv__stream_eof(stream,(uv_buf_t *)local_138);
      iVar11 = w->fd;
    }
    if (((events & 0x1c) != 0) && (iVar11 != -1)) {
      uv__write(stream);
      uv__write_callbacks(stream);
      if ((uv__io_t *)w[1].cb == w + 1) {
        uv__drain(stream);
      }
    }
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (uv__queue_empty(&stream->write_queue))
      uv__drain(stream);
  }
}